

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O2

void FDDSTexture::CalcBitShift(DWORD mask,BYTE *lshiftp,BYTE *rshiftp)

{
  BYTE BVar1;
  
  BVar1 = '\0';
  if (mask == 0) {
    *rshiftp = '\0';
    *lshiftp = '\0';
    return;
  }
  for (; -1 < (int)mask; mask = mask * 2) {
    BVar1 = BVar1 + '\x01';
  }
  *lshiftp = BVar1;
  BVar1 = '\0';
  for (; (int)mask < 0; mask = mask * 2) {
    BVar1 = BVar1 + '\x01';
  }
  *rshiftp = BVar1;
  return;
}

Assistant:

void FDDSTexture::CalcBitShift (DWORD mask, BYTE *lshiftp, BYTE *rshiftp)
{
	BYTE shift;

	if (mask == 0)
	{
		*lshiftp = *rshiftp = 0;
		return;
	}

	shift = 0;
	while ((mask & 0x80000000) == 0)
	{
		mask <<= 1;
		shift++;
	}
	*lshiftp = shift;

	shift = 0;
	while (mask & 0x80000000)
	{
		mask <<= 1;
		shift++;
	}
	*rshiftp = shift;
}